

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::OutputFile::breakScanLine(OutputFile *this,int y,int offset,int length,char c)

{
  long *plVar1;
  reference pvVar2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  stringstream _iex_throw_s;
  uint64_t position;
  lock_guard<std::mutex> lock;
  stringstream *in_stack_fffffffffffffdf8;
  lock_guard<std::mutex> *in_stack_fffffffffffffe00;
  int local_1c4;
  stringstream local_1c0 [16];
  ostream local_1b0 [392];
  value_type local_28;
  undefined1 local_15;
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffe00,(mutex_type *)in_stack_fffffffffffffdf8);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      (*(long *)(in_RDI + 8) + 0x98),
                      (long)((local_c - *(int *)(*(long *)(in_RDI + 8) + 0x8c)) /
                            *(int *)(*(long *)(in_RDI + 8) + 0x120)));
  local_28 = *pvVar2;
  if (local_28 == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar3 = std::operator<<(local_1b0,"Cannot overwrite scan line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3,". The scan line has not yet been stored in file \"");
    pcVar4 = fileName((OutputFile *)0x14daf8);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::operator<<(poVar3,"\".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_fffffffffffffdf8);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x30) = 0;
  plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x28);
  (**(code **)(*plVar1 + 0x20))(plVar1,local_28 + (long)local_10);
  for (local_1c4 = 0; local_1c4 < local_14; local_1c4 = local_1c4 + 1) {
    plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x138) + 0x28);
    (**(code **)(*plVar1 + 0x10))(plVar1,&local_15,1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x14dc64);
  return;
}

Assistant:

void
OutputFile::breakScanLine (int y, int offset, int length, char c)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    uint64_t position =
        _data->lineOffsets[(y - _data->minY) / _data->linesInBuffer];

    if (!position)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot overwrite scan line "
                << y
                << ". "
                   "The scan line has not yet been stored in "
                   "file \""
                << fileName () << "\".");

    _data->_streamData->currentPosition = 0;
    _data->_streamData->os->seekp (position + offset);

    for (int i = 0; i < length; ++i)
        _data->_streamData->os->write (&c, 1);
}